

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O0

uint64_t aom_sum_sse_2d_i16_nxn_avx2(int16_t *src,int stride,int width,int height,int *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int *in_R8;
  undefined1 auVar9 [32];
  __m128i v;
  __m128i sse_128bit;
  __m128i v_sse_total_hi;
  __m128i v_sse_total_lo;
  __m128i sum_128bit;
  __m128i v_sum_total_hi;
  __m128i v_sum_total_low;
  __m256i v_sse_row_hi;
  __m256i v_sse_row_low;
  __m256i v_sq_0123_d;
  __m256i v_sq_23_d;
  __m256i v_sq_01_d;
  __m256i v_sq_3_d;
  __m256i v_sq_2_d;
  __m256i v_sq_1_d;
  __m256i v_sq_0_d;
  __m256i v_sum_0123;
  __m256i v_sum_23;
  __m256i v_sum_01;
  __m256i v_val_3_w;
  __m256i v_val_2_w;
  __m256i v_val_1_w;
  __m256i v_val_0_w;
  int16_t *tempsrc;
  int row;
  __m256i v_sse_row;
  int col;
  __m256i v_sum_total;
  __m256i v_sse_total;
  __m256i one_reg;
  __m256i zero_reg;
  uint64_t result;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  int local_744;
  undefined1 local_740 [32];
  int local_704;
  undefined1 local_700 [24];
  undefined8 uStack_6e8;
  undefined1 local_6e0 [24];
  undefined8 uStack_6c8;
  uint64_t local_668 [3];
  int local_64c;
  long local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 (*local_620) [32];
  undefined1 (*local_618) [32];
  undefined1 (*local_610) [32];
  undefined1 (*local_608) [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [16];
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined2 local_182;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined1 local_80 [32];
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  
  local_64c = (int)in_RSI;
  local_640 = 0;
  uStack_638 = 0;
  uStack_630 = 0;
  uStack_628 = 0;
  local_182 = 1;
  local_32 = 1;
  local_34 = 1;
  local_36 = 1;
  local_38 = 1;
  local_3a = 1;
  local_3c = 1;
  local_3e = 1;
  local_40 = 1;
  local_42 = 1;
  local_44 = 1;
  local_46 = 1;
  local_48 = 1;
  local_4a = 1;
  local_4c = 1;
  local_4e = 1;
  local_50 = 1;
  auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar1 = vpinsrw_avx(auVar1,1,2);
  auVar1 = vpinsrw_avx(auVar1,1,3);
  auVar1 = vpinsrw_avx(auVar1,1,4);
  auVar1 = vpinsrw_avx(auVar1,1,5);
  auVar1 = vpinsrw_avx(auVar1,1,6);
  auVar1 = vpinsrw_avx(auVar1,1,7);
  auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar2 = vpinsrw_avx(auVar2,1,2);
  auVar2 = vpinsrw_avx(auVar2,1,3);
  auVar2 = vpinsrw_avx(auVar2,1,4);
  auVar2 = vpinsrw_avx(auVar2,1,5);
  auVar2 = vpinsrw_avx(auVar2,1,6);
  auVar2 = vpinsrw_avx(auVar2,1,7);
  auVar9._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar9._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_80._16_8_ = auVar9._16_8_;
  local_80._24_8_ = auVar9._24_8_;
  _local_6e0 = ZEXT1632(ZEXT816(0));
  _local_700 = ZEXT1632(ZEXT816(0));
  local_704 = 0;
  local_648 = in_RDI;
  while( true ) {
    auVar1 = stack0xfffffffffffff930;
    if (in_ECX <= local_704) break;
    local_740 = ZEXT1632(ZEXT816(0));
    local_744 = 0;
    while( true ) {
      if (in_EDX <= local_744) break;
      local_608 = (undefined1 (*) [32])(local_648 + (long)local_744 * 2);
      local_560 = *(undefined8 *)*local_608;
      uStack_558 = *(undefined8 *)(*local_608 + 8);
      uStack_550 = *(undefined8 *)(*local_608 + 0x10);
      uStack_548 = *(undefined8 *)(*local_608 + 0x18);
      local_610 = (undefined1 (*) [32])(*local_608 + (long)local_64c * 2);
      local_580 = *(undefined8 *)*local_610;
      uStack_578 = *(undefined8 *)(*local_610 + 8);
      uStack_570 = *(undefined8 *)(*local_610 + 0x10);
      uStack_568 = *(undefined8 *)(*local_610 + 0x18);
      local_618 = (undefined1 (*) [32])(*local_608 + (long)(local_64c << 1) * 2);
      local_5a0 = *(undefined8 *)*local_618;
      uStack_598 = *(undefined8 *)(*local_618 + 8);
      uStack_590 = *(undefined8 *)(*local_618 + 0x10);
      uStack_588 = *(undefined8 *)(*local_618 + 0x18);
      local_620 = (undefined1 (*) [32])(*local_608 + (long)(local_64c * 3) * 2);
      local_5c0 = *(undefined8 *)*local_620;
      uStack_5b8 = *(undefined8 *)(*local_620 + 8);
      uStack_5b0 = *(undefined8 *)(*local_620 + 0x10);
      uStack_5a8 = *(undefined8 *)(*local_620 + 0x18);
      auVar3 = vpaddw_avx2(*local_608,*local_610);
      auVar4 = vpaddw_avx2(*local_618,*local_620);
      local_800 = auVar3._0_8_;
      local_5e0 = local_800;
      uStack_7f8 = auVar3._8_8_;
      uStack_5d8 = uStack_7f8;
      uStack_7f0 = auVar3._16_8_;
      uStack_5d0 = uStack_7f0;
      uStack_7e8 = auVar3._24_8_;
      uStack_5c8 = uStack_7e8;
      local_820 = auVar4._0_8_;
      local_600 = local_820;
      uStack_818 = auVar4._8_8_;
      uStack_5f8 = uStack_818;
      uStack_810 = auVar4._16_8_;
      uStack_5f0 = uStack_810;
      uStack_808 = auVar4._24_8_;
      uStack_5e8 = uStack_808;
      auVar3 = vpaddw_avx2(auVar3,auVar4);
      local_840 = auVar3._0_8_;
      local_420 = local_840;
      uStack_838 = auVar3._8_8_;
      uStack_418 = uStack_838;
      uStack_830 = auVar3._16_8_;
      uStack_410 = uStack_830;
      uStack_828 = auVar3._24_8_;
      uStack_408 = uStack_828;
      uStack_430 = local_80._16_8_;
      uStack_428 = local_80._24_8_;
      auVar4._16_8_ = local_80._16_8_;
      auVar4._0_16_ = auVar9._0_16_;
      auVar4._24_8_ = local_80._24_8_;
      auVar3 = vpmaddwd_avx2(auVar3,auVar4);
      local_2e0 = local_700._0_8_;
      uStack_2d8 = local_700._8_8_;
      uStack_2d0 = local_700._16_8_;
      uStack_2c8 = uStack_6e8;
      local_840 = auVar3._0_8_;
      local_300 = local_840;
      uStack_838 = auVar3._8_8_;
      uStack_2f8 = uStack_838;
      uStack_830 = auVar3._16_8_;
      uStack_2f0 = uStack_830;
      uStack_828 = auVar3._24_8_;
      uStack_2e8 = uStack_828;
      _local_700 = vpaddd_avx2(_local_700,auVar3);
      auVar3 = vpmaddwd_avx2(*local_608,*local_608);
      auVar4 = vpmaddwd_avx2(*local_610,*local_610);
      auVar5 = vpmaddwd_avx2(*local_618,*local_618);
      auVar6 = vpmaddwd_avx2(*local_620,*local_620);
      local_860 = auVar3._0_8_;
      local_320 = local_860;
      uStack_858 = auVar3._8_8_;
      uStack_318 = uStack_858;
      uStack_850 = auVar3._16_8_;
      uStack_310 = uStack_850;
      uStack_848 = auVar3._24_8_;
      uStack_308 = uStack_848;
      local_880 = auVar4._0_8_;
      local_340 = local_880;
      uStack_878 = auVar4._8_8_;
      uStack_338 = uStack_878;
      uStack_870 = auVar4._16_8_;
      uStack_330 = uStack_870;
      uStack_868 = auVar4._24_8_;
      uStack_328 = uStack_868;
      auVar3 = vpaddd_avx2(auVar3,auVar4);
      local_8a0 = auVar5._0_8_;
      local_360 = local_8a0;
      uStack_898 = auVar5._8_8_;
      uStack_358 = uStack_898;
      uStack_890 = auVar5._16_8_;
      uStack_350 = uStack_890;
      uStack_888 = auVar5._24_8_;
      uStack_348 = uStack_888;
      local_8c0 = auVar6._0_8_;
      local_380 = local_8c0;
      uStack_8b8 = auVar6._8_8_;
      uStack_378 = uStack_8b8;
      uStack_8b0 = auVar6._16_8_;
      uStack_370 = uStack_8b0;
      uStack_8a8 = auVar6._24_8_;
      uStack_368 = uStack_8a8;
      auVar4 = vpaddd_avx2(auVar5,auVar6);
      local_8e0 = auVar3._0_8_;
      local_3a0 = local_8e0;
      uStack_8d8 = auVar3._8_8_;
      uStack_398 = uStack_8d8;
      uStack_8d0 = auVar3._16_8_;
      uStack_390 = uStack_8d0;
      uStack_8c8 = auVar3._24_8_;
      uStack_388 = uStack_8c8;
      local_900 = auVar4._0_8_;
      local_3c0 = local_900;
      uStack_8f8 = auVar4._8_8_;
      uStack_3b8 = uStack_8f8;
      uStack_8f0 = auVar4._16_8_;
      uStack_3b0 = uStack_8f0;
      uStack_8e8 = auVar4._24_8_;
      uStack_3a8 = uStack_8e8;
      auVar3 = vpaddd_avx2(auVar3,auVar4);
      local_3e0 = local_740._0_8_;
      uStack_3d8 = local_740._8_8_;
      uStack_3d0 = local_740._16_8_;
      uStack_3c8 = local_740._24_8_;
      local_920 = auVar3._0_8_;
      local_400 = local_920;
      uStack_918 = auVar3._8_8_;
      uStack_3f8 = uStack_918;
      uStack_910 = auVar3._16_8_;
      uStack_3f0 = uStack_910;
      uStack_908 = auVar3._24_8_;
      uStack_3e8 = uStack_908;
      local_740 = vpaddd_avx2(local_740,auVar3);
      local_744 = local_744 + 0x10;
      local_540 = local_5c0;
      uStack_538 = uStack_5b8;
      uStack_530 = uStack_5b0;
      uStack_528 = uStack_5a8;
      local_520 = local_5c0;
      uStack_518 = uStack_5b8;
      uStack_510 = uStack_5b0;
      uStack_508 = uStack_5a8;
      local_500 = local_5a0;
      uStack_4f8 = uStack_598;
      uStack_4f0 = uStack_590;
      uStack_4e8 = uStack_588;
      local_4e0 = local_5a0;
      uStack_4d8 = uStack_598;
      uStack_4d0 = uStack_590;
      uStack_4c8 = uStack_588;
      local_4c0 = local_580;
      uStack_4b8 = uStack_578;
      uStack_4b0 = uStack_570;
      uStack_4a8 = uStack_568;
      local_4a0 = local_580;
      uStack_498 = uStack_578;
      uStack_490 = uStack_570;
      uStack_488 = uStack_568;
      local_480 = local_560;
      uStack_478 = uStack_558;
      uStack_470 = uStack_550;
      uStack_468 = uStack_548;
      local_460 = local_560;
      uStack_458 = uStack_558;
      uStack_450 = uStack_550;
      uStack_448 = uStack_548;
      local_440 = auVar9._0_16_;
    }
    local_160 = local_740._0_8_;
    uStack_158 = local_740._8_8_;
    uStack_150 = local_740._16_8_;
    uStack_148 = local_740._24_8_;
    local_180 = 0;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    auVar4 = vpunpckldq_avx2(local_740,ZEXT1632(ZEXT816(0)));
    local_120 = local_740._0_8_;
    uStack_118 = local_740._8_8_;
    uStack_110 = local_740._16_8_;
    uStack_108 = local_740._24_8_;
    local_140 = 0;
    uStack_138 = 0;
    uStack_130 = 0;
    uStack_128 = 0;
    auVar3 = vpunpckhdq_avx2(local_740,ZEXT1632(ZEXT816(0)));
    local_940 = auVar4._0_8_;
    local_260 = local_940;
    uStack_938 = auVar4._8_8_;
    uStack_258 = uStack_938;
    uStack_930 = auVar4._16_8_;
    uStack_250 = uStack_930;
    uStack_928 = auVar4._24_8_;
    uStack_248 = uStack_928;
    local_960 = auVar3._0_8_;
    local_280 = local_960;
    uStack_958 = auVar3._8_8_;
    uStack_278 = uStack_958;
    uStack_950 = auVar3._16_8_;
    uStack_270 = uStack_950;
    uStack_948 = auVar3._24_8_;
    uStack_268 = uStack_948;
    auVar3 = vpaddq_avx2(auVar4,auVar3);
    local_2a0 = local_6e0._0_8_;
    uStack_298 = local_6e0._8_8_;
    uStack_290 = local_6e0._16_8_;
    uStack_288 = uStack_6c8;
    local_740._0_8_ = auVar3._0_8_;
    local_2c0 = local_740._0_8_;
    local_740._8_8_ = auVar3._8_8_;
    uStack_2b8 = local_740._8_8_;
    local_740._16_8_ = auVar3._16_8_;
    uStack_2b0 = local_740._16_8_;
    local_740._24_8_ = auVar3._24_8_;
    uStack_2a8 = local_740._24_8_;
    _local_6e0 = vpaddq_avx2(_local_6e0,auVar3);
    local_648 = local_648 + (long)(local_64c << 2) * 2;
    local_704 = local_704 + 4;
  }
  local_220 = local_700._0_8_;
  uStack_218 = local_700._8_8_;
  uStack_210 = local_700._16_8_;
  uStack_208 = uStack_6e8;
  uStack_b8 = uStack_6e8;
  local_c0 = local_700._16_8_;
  auVar7._8_8_ = uStack_978;
  auVar7._0_8_ = local_980;
  local_d0 = vpaddd_avx(auVar7,stack0xfffffffffffff910);
  local_e0 = vpsrldq_avx(local_d0,8);
  local_f0 = vpaddd_avx(local_d0,local_e0);
  local_100 = vpsrldq_avx(local_f0,4);
  auVar2 = vpaddd_avx(local_f0,local_100);
  local_990 = auVar2._0_8_;
  uStack_988 = auVar2._8_8_;
  local_90 = local_990;
  uStack_88 = uStack_988;
  local_a0 = local_990;
  uVar8 = local_a0;
  uStack_98 = uStack_988;
  local_a0._0_4_ = auVar2._0_4_;
  *in_R8 = *in_R8 + (int)local_a0;
  local_240 = local_6e0._0_8_;
  uStack_238 = local_6e0._8_8_;
  uStack_230 = local_6e0._16_8_;
  uStack_228 = uStack_6c8;
  uStack_1b8 = uStack_6c8;
  local_1c0 = local_6e0._16_8_;
  auVar2._8_8_ = uStack_9a8;
  auVar2._0_8_ = local_9b0;
  auVar1 = vpaddq_avx(auVar1,auVar2);
  local_9c0 = auVar1._0_8_;
  uStack_9b8 = auVar1._8_8_;
  local_1a0 = local_9c0;
  uStack_198 = uStack_9b8;
  local_1b0 = local_9c0;
  uStack_1a8 = uStack_9b8;
  local_1f0 = vpunpckhqdq_avx(auVar1,auVar1);
  local_1e0 = local_9c0;
  uStack_1d8 = uStack_9b8;
  vpaddq_avx(auVar1,local_1f0);
  v[1]._0_4_ = (int)local_a0;
  v[0] = in_RSI;
  v[1]._4_4_ = 0;
  local_a0 = uVar8;
  local_80 = auVar9;
  xx_storel_64(local_668,v);
  return local_668[0];
}

Assistant:

static uint64_t aom_sum_sse_2d_i16_nxn_avx2(const int16_t *src, int stride,
                                            int width, int height, int *sum) {
  uint64_t result;
  const __m256i zero_reg = _mm256_setzero_si256();
  const __m256i one_reg = _mm256_set1_epi16(1);

  __m256i v_sse_total = zero_reg;
  __m256i v_sum_total = zero_reg;

  for (int col = 0; col < height; col += 4) {
    __m256i v_sse_row = zero_reg;
    for (int row = 0; row < width; row += 16) {
      const int16_t *tempsrc = src + row;
      const __m256i v_val_0_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 0 * stride));
      const __m256i v_val_1_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 1 * stride));
      const __m256i v_val_2_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 2 * stride));
      const __m256i v_val_3_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 3 * stride));

      const __m256i v_sum_01 = _mm256_add_epi16(v_val_0_w, v_val_1_w);
      const __m256i v_sum_23 = _mm256_add_epi16(v_val_2_w, v_val_3_w);
      __m256i v_sum_0123 = _mm256_add_epi16(v_sum_01, v_sum_23);
      v_sum_0123 = _mm256_madd_epi16(v_sum_0123, one_reg);
      v_sum_total = _mm256_add_epi32(v_sum_total, v_sum_0123);

      const __m256i v_sq_0_d = _mm256_madd_epi16(v_val_0_w, v_val_0_w);
      const __m256i v_sq_1_d = _mm256_madd_epi16(v_val_1_w, v_val_1_w);
      const __m256i v_sq_2_d = _mm256_madd_epi16(v_val_2_w, v_val_2_w);
      const __m256i v_sq_3_d = _mm256_madd_epi16(v_val_3_w, v_val_3_w);
      const __m256i v_sq_01_d = _mm256_add_epi32(v_sq_0_d, v_sq_1_d);
      const __m256i v_sq_23_d = _mm256_add_epi32(v_sq_2_d, v_sq_3_d);
      const __m256i v_sq_0123_d = _mm256_add_epi32(v_sq_01_d, v_sq_23_d);
      v_sse_row = _mm256_add_epi32(v_sse_row, v_sq_0123_d);
    }
    const __m256i v_sse_row_low = _mm256_unpacklo_epi32(v_sse_row, zero_reg);
    const __m256i v_sse_row_hi = _mm256_unpackhi_epi32(v_sse_row, zero_reg);
    v_sse_row = _mm256_add_epi64(v_sse_row_low, v_sse_row_hi);
    v_sse_total = _mm256_add_epi64(v_sse_total, v_sse_row);
    src += 4 * stride;
  }

  const __m128i v_sum_total_low = _mm256_castsi256_si128(v_sum_total);
  const __m128i v_sum_total_hi = _mm256_extracti128_si256(v_sum_total, 1);
  __m128i sum_128bit = _mm_add_epi32(v_sum_total_hi, v_sum_total_low);
  sum_128bit = _mm_add_epi32(sum_128bit, _mm_srli_si128(sum_128bit, 8));
  sum_128bit = _mm_add_epi32(sum_128bit, _mm_srli_si128(sum_128bit, 4));
  *sum += _mm_cvtsi128_si32(sum_128bit);

  __m128i v_sse_total_lo = _mm256_castsi256_si128(v_sse_total);
  __m128i v_sse_total_hi = _mm256_extracti128_si256(v_sse_total, 1);
  __m128i sse_128bit = _mm_add_epi64(v_sse_total_lo, v_sse_total_hi);

  sse_128bit =
      _mm_add_epi64(sse_128bit, _mm_unpackhi_epi64(sse_128bit, sse_128bit));

  xx_storel_64(&result, sse_128bit);

  return result;
}